

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

int __thiscall
fmp4_stream::ingest_stream::load_from_file(ingest_stream *this,istream *infile,bool init_only)

{
  pointer *this_00;
  bool bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  reference pvVar6;
  pointer pbVar7;
  reference pbVar8;
  ostream *poVar9;
  size_type sVar10;
  size_t in_RCX;
  void *__buf;
  exception e;
  allocator<char> local_7c9;
  string local_7c8;
  undefined1 local_7a8 [8];
  emsg e_2;
  string local_6c0;
  allocator<char> local_699;
  string local_698 [8];
  string enc_box_name;
  uint local_670;
  uint32_t l_size;
  uint32_t i;
  uint8_t name [9];
  uint32_t index;
  box *local_638;
  undefined1 local_630 [8];
  emsg e_1;
  __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
  prev_box;
  bool mdat_found;
  undefined1 local_530 [8];
  media_fragment m;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
  local_d0;
  __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
  local_c8;
  iterator it;
  undefined1 local_b8 [8];
  box b;
  vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> ingest_boxes;
  bool init_only_local;
  istream *infile_local;
  ingest_stream *this_local;
  
  bVar1 = std::ios::operator_cast_to_bool((ios *)(infile + *(long *)(*(long *)infile + -0x18)));
  if (bVar1) {
    std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::vector
              ((vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> *)&b.is_large_);
    do {
      bVar2 = std::ios::good();
      if ((bVar2 & 1) == 0) break;
      box::box((box *)local_b8);
      uVar4 = box::read((box *)local_b8,(int)infile,__buf,in_RCX);
      if ((uVar4 & 1) == 0) {
        it._M_current._4_4_ = 3;
      }
      else {
        std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::push_back
                  ((vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> *)&b.is_large_,
                   (value_type *)local_b8);
        iVar3 = std::__cxx11::string::compare((char *)&b.large_size_);
        if (iVar3 == 0) {
          it._M_current._4_4_ = 3;
        }
        else {
          it._M_current._4_4_ = 0;
        }
      }
      box::~box((box *)local_b8);
    } while (it._M_current._4_4_ == 0);
    local_c8._M_current =
         (box *)std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::begin
                          ((vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> *)
                           &b.is_large_);
    while( true ) {
      local_d0._M_current =
           (box *)std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::end
                            ((vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> *)
                             &b.is_large_);
      bVar1 = __gnu_cxx::operator!=(&local_c8,&local_d0);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
      ::operator->(&local_c8);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"ftyp",&local_f1);
      bVar1 = f_compare_4cc(pcVar5,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
      if (bVar1) {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                 ::operator*(&local_c8);
        box::operator=((box *)this,pbVar8);
      }
      __gnu_cxx::
      __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
      ::operator->(&local_c8);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"moov",&local_119);
      bVar1 = f_compare_4cc(pcVar5,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
      if (bVar1) {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                 ::operator*(&local_c8);
        box::operator=(&(this->init_fragment_).moov_box_,pbVar8);
        if (init_only) {
          this_local._4_4_ = 0;
          it._M_current._4_4_ = 1;
          goto LAB_0010b27f;
        }
      }
      __gnu_cxx::
      __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
      ::operator->(&local_c8);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"moof",
                 (allocator<char> *)
                 ((long)&m.trun_.m_sentry.
                         super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      bVar1 = f_compare_4cc(pcVar5,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&m.trun_.m_sentry.
                         super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      if (bVar1) {
        box::box((box *)local_530);
        box::box((box *)&m.styp_.is_large_);
        m.prft_.is_large_ = false;
        m.prft_.has_uuid_ = false;
        m.prft_._98_6_ = 0;
        m.emsg_.super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        m.emsg_.super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>::vector
                  ((vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_> *)
                   &m.prft_.is_large_);
        m.emsg_.super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        box::box((box *)&m.e_msg_is_in_mdat_);
        box::box((box *)&m.moof_box_.is_large_);
        m.mdat_box_.is_large_ = false;
        m.mdat_box_.has_uuid_ = false;
        m.mdat_box_._98_6_ = 0;
        m.trex_.track_id_ = 0;
        m.trex_.default_sample_description_index_ = 0;
        m.trex_.default_sample_duration_ = 0;
        mfhd::mfhd((mfhd *)&m.trex_.default_sample_flags_);
        tfhd::tfhd((tfhd *)&m.mfhd_.super_full_box.magic_conf_);
        tfdt::tfdt((tfdt *)&m.tfhd_.default_sample_size_);
        trun::trun((trun *)&m.tfdt_.base_media_decode_time_);
        pbVar8 = __gnu_cxx::
                 __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                 ::operator*(&local_c8);
        box::operator=((box *)&m.e_msg_is_in_mdat_,pbVar8);
        init_fragment::get_trex((trex *)((long)&prev_box._M_current + 4),&this->init_fragment_);
        m.mdat_box_.is_large_ = prev_box._M_current._4_1_;
        m.mdat_box_.has_uuid_ = prev_box._M_current._5_1_;
        m.mdat_box_._98_6_ = stack0xfffffffffffffabe;
        prev_box._M_current._3_1_ = 0;
        e_1.message_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)__gnu_cxx::
                      __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                      ::operator-(&local_c8,1);
        pbVar7 = __gnu_cxx::
                 __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                 ::operator->((__normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                               *)&e_1.message_data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar3 = std::__cxx11::string::compare((char *)&pbVar7->box_type_);
        if (iVar3 == 0) {
          emsg::emsg((emsg *)local_630);
          this_00 = &e_1.message_data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          pbVar7 = __gnu_cxx::
                   __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                   ::operator->((__normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                                 *)this_00);
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&pbVar7->box_data_,0);
          pbVar7 = __gnu_cxx::
                   __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                   ::operator->((__normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                                 *)this_00);
          sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             (&pbVar7->box_data_);
          emsg::parse((emsg *)local_630,(char *)pvVar6,(uint)sVar10);
          std::vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>::push_back
                    ((vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_> *)
                     &m.prft_.is_large_,(value_type *)local_630);
          emsg::~emsg((emsg *)local_630);
        }
        do {
          if (((prev_box._M_current._3_1_ ^ 0xff) & 1) == 0) goto LAB_0010b13b;
          local_638 = (box *)__gnu_cxx::
                             __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                             ::operator++(&local_c8,0);
          __gnu_cxx::
          __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
          ::operator->(&local_c8);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&index,"mdat",(allocator<char> *)(name + 8));
          bVar1 = f_compare_4cc(pcVar5,(string *)&index);
          std::__cxx11::string::~string((string *)&index);
          std::allocator<char>::~allocator((allocator<char> *)(name + 8));
        } while (!bVar1);
        pbVar8 = __gnu_cxx::
                 __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                 ::operator*(&local_c8);
        box::operator=((box *)&m.moof_box_.is_large_,pbVar8);
        prev_box._M_current._3_1_ = 1;
        media_fragment::parse_moof((media_fragment *)local_530);
        name[1] = '\b';
        name[2] = '\0';
        name[3] = '\0';
        name[4] = '\0';
        do {
          uVar4 = (ulong)(uint)name._1_4_;
          sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              (m.mdat_box_.extended_type_ + 8));
          if (sVar10 <= uVar4) break;
          memset((void *)((long)&l_size + 3),0,9);
          for (local_670 = 0; local_670 < 8; local_670 = local_670 + 1) {
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                (m.mdat_box_.extended_type_ + 8),(ulong)(name._1_4_ + local_670));
            *(value_type *)((long)&l_size + (ulong)local_670 + 3) = *pvVar6;
          }
          name[0] = '\0';
          enc_box_name.field_2._12_4_ =
               anon_unknown.dwarf_124a5::fmp4_read_uint32((char *)((long)&l_size + 3));
          uVar4 = (ulong)(uint)enc_box_name.field_2._12_4_;
          sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              (m.mdat_box_.extended_type_ + 8));
          if (sVar10 < uVar4) break;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_698,(char *)((long)&i + 3),&local_699);
          std::allocator<char>::~allocator(&local_699);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6c0,"emsg",
                     (allocator<char> *)
                     ((long)&e_2.message_data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          bVar1 = f_compare_4cc(pcVar5,&local_6c0);
          std::__cxx11::string::~string((string *)&local_6c0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&e_2.message_data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          if (bVar1) {
            emsg::emsg((emsg *)local_7a8);
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                (m.mdat_box_.extended_type_ + 8),(ulong)(uint)name._1_4_);
            emsg::parse((emsg *)local_7a8,(char *)pvVar6,enc_box_name.field_2._12_4_);
            std::vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>::push_back
                      ((vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_> *)
                       &m.prft_.is_large_,(value_type *)local_7a8);
            m.emsg_.super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
            name._1_4_ = enc_box_name.field_2._12_4_ + name._1_4_;
            it._M_current._4_4_ = 9;
            emsg::~emsg((emsg *)local_7a8);
          }
          else {
            pcVar5 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_7c8,"embe",&local_7c9);
            bVar1 = f_compare_4cc(pcVar5,&local_7c8);
            std::__cxx11::string::~string((string *)&local_7c8);
            std::allocator<char>::~allocator(&local_7c9);
            if (bVar1) {
              name._1_4_ = enc_box_name.field_2._12_4_ + name._1_4_;
              it._M_current._4_4_ = 9;
            }
            else {
              it._M_current._4_4_ = 10;
            }
          }
          std::__cxx11::string::~string(local_698);
        } while (it._M_current._4_4_ == 9);
        std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>::
        push_back(&this->media_fragment_,(value_type *)local_530);
LAB_0010b13b:
        media_fragment::~media_fragment((media_fragment *)local_530);
      }
      pbVar7 = __gnu_cxx::
               __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
               ::operator->(&local_c8);
      iVar3 = std::__cxx11::string::compare((char *)&pbVar7->box_type_);
      if (iVar3 == 0) {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                 ::operator*(&local_c8);
        box::operator=(&this->mfra_box_,pbVar8);
      }
      pbVar7 = __gnu_cxx::
               __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
               ::operator->(&local_c8);
      iVar3 = std::__cxx11::string::compare((char *)&pbVar7->box_type_);
      if (iVar3 == 0) {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                 ::operator*(&local_c8);
        box::operator=(&this->sidx_box_,pbVar8);
        std::operator<<((ostream *)&std::cout,"|sidx|");
      }
      pbVar7 = __gnu_cxx::
               __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
               ::operator->(&local_c8);
      iVar3 = std::__cxx11::string::compare((char *)&pbVar7->box_type_);
      if (iVar3 == 0) {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
                 ::operator*(&local_c8);
        box::operator=(&this->meta_box_,pbVar8);
        std::operator<<((ostream *)&std::cout,"|meta|");
      }
      __gnu_cxx::
      __normal_iterator<fmp4_stream::box_*,_std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>_>
      ::operator++(&local_c8);
    }
    it._M_current._4_4_ = 0;
LAB_0010b27f:
    std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::~vector
              ((vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> *)&b.is_large_);
    if (it._M_current._4_4_ != 0) {
      return this_local._4_4_;
    }
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,"***  finished reading fmp4 fragments  ***");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,"***  read  fmp4 init fragment         ***");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,"***  read ");
  sVar10 = std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>::
           size(&this->media_fragment_);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar10);
  poVar9 = std::operator<<(poVar9," fmp4 media fragments ***");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int ingest_stream::load_from_file(std::istream &infile, bool init_only)
	{
		try
		{
			if (infile)
			{
				std::vector<box> ingest_boxes;

				while (infile.good()) // read box by box in a vector
				{
					box b = {};
					if (b.read(infile))
						ingest_boxes.push_back(b);
					else  // break when we have boxes of size zero
						break;

					if (b.box_type_.compare("mfra") == 0)
						break;
				}

				// organize the boxes in init fragments and media fragments 
				for (auto it = ingest_boxes.begin(); it != ingest_boxes.end(); ++it)
				{
					if (f_compare_4cc( (char *)it->box_type_.c_str(), "ftyp"))
						init_fragment_.ftyp_box_ = *it;
					if (f_compare_4cc((char*)it->box_type_.c_str(), "moov"))
					{
						init_fragment_.moov_box_ = *it;
						
						if (init_only)
							return 0;
					}

					if (f_compare_4cc((char*)it->box_type_.c_str(), "moof")) // in case of moof box we push both the moof and following mdat
					{
						media_fragment m = {};
						m.moof_box_ = *it;
						m.trex_ = init_fragment_.get_trex();
						bool mdat_found = false;
						auto prev_box = (it - 1);
						// see if there is an emsg before
						if (prev_box->box_type_.compare("emsg") == 0)
						{
							emsg e;
							e.parse((char *)& prev_box->box_data_[0], (unsigned int)prev_box->box_data_.size());
							m.emsg_.push_back(e);
							//cout << "|emsg|";
							//std::cout << "found inband dash emsg box" << std::endl;
						}
						//cout << "|moof|";
						while (!mdat_found)
						{
							it++;

							if (f_compare_4cc((char*)it->box_type_.c_str(), "mdat"))
							{
								// find event messages embedded in 

								m.mdat_box_ = *it;
								mdat_found = true;
								m.parse_moof();

								uint32_t index = 8;

								while (index < m.mdat_box_.box_data_.size())
								{
									// seek to next box in 
									uint8_t name[9] = {};
									for (uint32_t i = 0; i < 8; i++)
										name[i] = m.mdat_box_.box_data_[index + i];
									name[8] = '\0';
									uint32_t l_size = fmp4_read_uint32((char *)name);

									if (l_size > m.mdat_box_.box_data_.size())
										break;

									std::string enc_box_name((char *)&name[4]);

									if (f_compare_4cc((char*)enc_box_name.c_str(), "emsg") ) // right now we can only parse a single emsg, todo update to parse multiple emsg
									{
										emsg e = {};
										e.parse((char *)&m.mdat_box_.box_data_[index], (unsigned int)l_size);
										m.emsg_.push_back(e);
										m.e_msg_is_in_mdat_ = true;
										index += l_size;
										continue;
									}
									if (f_compare_4cc((char*)enc_box_name.c_str(), "embe"))
									{
										index += l_size;
										continue;
									}
									break; // skip on all other mdat content only embe and emsg allowed
								}

								media_fragment_.push_back(m);

								break;
							}
						}
					}
					if (it->box_type_.compare("mfra") == 0)
					{
						this->mfra_box_ = *it;
					}
					if (it->box_type_.compare("sidx") == 0)
					{
						this->sidx_box_ = *it;
						std::cout << "|sidx|";
					}
					if (it->box_type_.compare("meta") == 0)
					{
						this->meta_box_ = *it;
						std::cout << "|meta|";
					}
				}
			}
			std::cout << std::endl;
			std::cout << "***  finished reading fmp4 fragments  ***" << std::endl;
			std::cout << "***  read  fmp4 init fragment         ***" << std::endl;
			std::cout << "***  read " << media_fragment_.size() << " fmp4 media fragments ***" << std::endl;

			return 0;
		}
		catch (std::exception e)
		{
			std::cout << e.what() << std::endl;
			return 0;
		}
	}